

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
args::FlagBase::GetProgramLine_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,FlagBase *this,HelpParams *params)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_17b;
  undefined1 local_17a;
  byte local_179;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  byte local_151;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  iterator local_108;
  size_type local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 local_b8 [8];
  string res;
  undefined1 local_88 [8];
  EitherFlag flag;
  Nargs local_50;
  undefined1 local_40 [8];
  string postfix;
  HelpParams *params_local;
  FlagBase *this_local;
  
  postfix.field_2._8_8_ = params;
  if ((params->proglineShowFlags & 1U) == 0) {
    memset(__return_storage_ptr__,0,0x18);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__);
  }
  else {
    iVar2 = (*(this->super_NamedBase).super_Base._vptr_Base[0x13])();
    local_50.min = CONCAT44(extraout_var,iVar2);
    Nargs::Nargs((Nargs *)((long)&flag.longFlag.field_2 + 8),0);
    bVar1 = operator==(&local_50,(Nargs *)((long)&flag.longFlag.field_2 + 8));
    if (bVar1) {
      std::__cxx11::string::string((string *)local_40);
    }
    else {
      (*(this->super_NamedBase).super_Base._vptr_Base[0x12])(local_40);
    }
    if ((*(byte *)(postfix.field_2._8_8_ + 0x1d1) & 1) == 0) {
      Matcher::GetLongOrAny((EitherFlag *)local_88,&this->matcher);
    }
    else {
      Matcher::GetShortOrAny((EitherFlag *)local_88,&this->matcher);
    }
    EitherFlag::str((string *)local_b8,(EitherFlag *)local_88,
                    (string *)(postfix.field_2._8_8_ + 0x28),
                    (string *)(postfix.field_2._8_8_ + 0x48));
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::operator+(&local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (postfix.field_2._8_8_ + 0x110),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      std::operator+(&local_d8,&local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (postfix.field_2._8_8_ + 0x130));
      std::__cxx11::string::operator+=((string *)local_b8,(string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
    }
    local_17a = 1;
    local_130 = &local_128;
    bVar1 = Base::IsRequired((Base *)this);
    local_151 = 0;
    local_179 = 0;
    if (bVar1) {
      std::operator+(&local_150,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (postfix.field_2._8_8_ + 0x150),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
      local_151 = 1;
      std::operator+(&local_128,&local_150,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (postfix.field_2._8_8_ + 0x170));
    }
    else {
      std::operator+(&local_178,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (postfix.field_2._8_8_ + 400),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8);
      local_179 = 1;
      std::operator+(&local_128,&local_178,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (postfix.field_2._8_8_ + 0x1b0));
    }
    local_17a = 0;
    local_108 = &local_128;
    local_100 = 1;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_17b);
    __l._M_len = local_100;
    __l._M_array = local_108;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__,__l,&local_17b);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_17b);
    local_1a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_108;
    do {
      local_1a8 = local_1a8 + -1;
      std::__cxx11::string::~string((string *)local_1a8);
    } while (local_1a8 != &local_128);
    if ((local_179 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_178);
    }
    if ((local_151 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_150);
    }
    std::__cxx11::string::~string((string *)local_b8);
    EitherFlag::~EitherFlag((EitherFlag *)local_88);
    std::__cxx11::string::~string((string *)local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::vector<std::string> GetProgramLine(const HelpParams &params) const override
            {
                if (!params.proglineShowFlags)
                {
                    return {};
                }

                const std::string postfix = NumberOfArguments() == 0 ? std::string() : Name();
                const EitherFlag flag = params.proglinePreferShortFlags ? matcher.GetShortOrAny() : matcher.GetLongOrAny();
                std::string res = flag.str(params.shortPrefix, params.longPrefix);
                if (!postfix.empty())
                {
                    res += params.proglineValueOpen + postfix + params.proglineValueClose;
                }

                return { IsRequired() ? params.proglineRequiredOpen + res + params.proglineRequiredClose
                                      : params.proglineNonrequiredOpen + res + params.proglineNonrequiredClose };
            }